

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

int __thiscall deqp::gles31::bb::BufferLayout::getBlockIndex(BufferLayout *this,string *name)

{
  pointer pBVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  size_type *psVar6;
  
  pBVar1 = (this->blocks).
           super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (uint)((ulong)((long)(this->blocks).
                               super__Vector_base<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 6);
  if (0 < (int)uVar5) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    psVar6 = &(pBVar1->name)._M_string_length;
    uVar4 = 0;
    do {
      __n = *psVar6;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((string *)(psVar6 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        return (int)uVar4;
      }
      uVar4 = uVar4 + 1;
      psVar6 = psVar6 + 8;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  return -1;
}

Assistant:

int BufferLayout::getBlockIndex (const string& name) const
{
	for (int ndx = 0; ndx < (int)blocks.size(); ndx++)
	{
		if (blocks[ndx].name == name)
			return ndx;
	}
	return -1;
}